

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall
QHostInfoResult::QHostInfoResult(QHostInfoResult *this,QObject *receiver,SlotObjUniquePtr slot)

{
  Data *pDVar1;
  undefined8 uVar2;
  
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002d0d58;
  if (receiver == (QObject *)0x0) {
    receiver = &this->super_QObject;
  }
  pDVar1 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(receiver);
  (this->receiver).wp.d = pDVar1;
  (this->receiver).wp.value = receiver;
  (this->slotObj)._M_t.
  super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
  super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
       *(QSlotObjectBase **)
        slot._M_t.
        super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
        super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  *(undefined8 *)
   slot._M_t.super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>.
   _M_t.super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
   super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl = 0;
  uVar2 = QObject::thread();
  QObject::moveToThread(this,uVar2);
  return;
}

Assistant:

QHostInfoResult::QHostInfoResult(const QObject *receiver, QtPrivate::SlotObjUniquePtr slot)
    : receiver{receiver ? receiver : this}, slotObj{std::move(slot)}
{
    Q_ASSERT(this->receiver);
    moveToThread(this->receiver->thread());
}